

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

size_t path_length(archive_entry *entry)

{
  mode_t mVar1;
  char *__s;
  size_t sVar2;
  char *path;
  mode_t type;
  archive_entry *entry_local;
  
  mVar1 = archive_entry_filetype(entry);
  __s = archive_entry_pathname(entry);
  if (__s != (char *)0x0) {
    if ((mVar1 == 0x4000) && ((*__s == '\0' || (sVar2 = strlen(__s), __s[sVar2 - 1] != '/')))) {
      sVar2 = strlen(__s);
      entry_local = (archive_entry *)(sVar2 + 1);
    }
    else {
      entry_local = (archive_entry *)strlen(__s);
    }
    return (size_t)entry_local;
  }
  return 0;
}

Assistant:

static size_t
path_length(struct archive_entry *entry)
{
	mode_t type;
	const char *path;

	type = archive_entry_filetype(entry);
	path = archive_entry_pathname(entry);

	if (path == NULL)
		return (0);
	if (type == AE_IFDIR &&
	    (path[0] == '\0' || path[strlen(path) - 1] != '/')) {
		return strlen(path) + 1;
	} else {
		return strlen(path);
	}
}